

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

int __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte key2;
  byte key1;
  int extraout_EAX;
  int in_ECX;
  uint in_EDX;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_00;
  undefined8 *in_R8;
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  local_50;
  node_ptr local_40;
  basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *local_38;
  
  bVar1 = *(byte *)(((ulong)ctx & 0xfffffffffffffff8) + 0x1f);
  if (7 < bVar1) {
    __assert_fail("result <= key_prefix_capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x298,
                  "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                 );
  }
  local_40.tagged_ptr = (uintptr_t)ctx;
  local_38 = this;
  if (in_EDX < bVar1) {
    this_00 = (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
               *)(((ulong)ctx & 0xfffffffffffffff8) + 0x18);
    key1 = key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
           ::operator[](this_00,(ulong)in_EDX);
    key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
    ::cut(this_00,(char)in_EDX + '\x01');
    local_50._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )*in_R8;
    key2 = *(byte *)(in_R8[1] + 0x20 + (ulong)(in_ECX + in_EDX));
    local_50._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
    ._M_head_impl =
         (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
          *)in_R8[1];
    in_R8[1] = 0;
    add_two_to_empty(local_38,key1,local_40,key2,&local_50);
    std::
    unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr(&local_50);
    return extraout_EAX;
  }
  __assert_fail("shared_prefix_len < source_key_prefix.length()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x527,
                "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::init(node_ptr, unsigned int, tree_depth_type, db_leaf_unique_ptr &&) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void init(node_ptr source_node, unsigned shared_prefix_len,
                      tree_depth_type depth, db_leaf_unique_ptr &&child1) {
    auto *const source_inode{source_node.template ptr<inode_type *>()};
    auto &source_key_prefix = source_inode->get_key_prefix();
    UNODB_DETAIL_ASSERT(shared_prefix_len < source_key_prefix.length());

    const auto diff_key_byte_i = depth + shared_prefix_len;
    const auto source_node_key_byte = source_key_prefix[shared_prefix_len];
    source_key_prefix.cut(static_cast<key_prefix_size>(shared_prefix_len) + 1U);
    const auto new_key_byte = child1->get_key_view()[diff_key_byte_i];
    add_two_to_empty(source_node_key_byte, source_node, new_key_byte,
                     std::move(child1));
  }